

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O1

Camera * CameraPerspectiveProjection
                   (Vector eye,Vector at,Vector up_v,uint16_t image_width,uint16_t image_height,
                   Real near,Real far,Real fov)

{
  undefined1 near_00 [16];
  undefined1 far_00 [16];
  Camera *pCVar1;
  Matrix *pMVar2;
  Matrix *a;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  undefined6 in_stack_fffffffffffffeb2;
  undefined6 in_stack_fffffffffffffec2;
  undefined8 uStack_138;
  Real __camera2ndc [4] [4];
  
  stack0xffffffffffffffcc = fov._0_10_;
  near_00._10_6_ = in_stack_fffffffffffffeb2;
  near_00._0_10_ = near._0_10_;
  far_00._10_6_ = in_stack_fffffffffffffec2;
  far_00._0_10_ = far._0_10_;
  pCVar1 = _CameraNew(eye,at,up_v,image_width,image_height,(Real)near_00,(Real)far_00);
  *(unkbyte10 *)&pCVar1->fov = stack0xffffffffffffffcc;
  tanl();
  in_ST0 = (longdouble)1 / in_ST0;
  lVar3 = *(longdouble *)&pCVar1->far - *(longdouble *)&pCVar1->near;
  __camera2ndc[0][0]._2_6_ = 0;
  __camera2ndc[0][2]._8_8_ = 0;
  __camera2ndc[0][3]._0_8_ = 0;
  __camera2ndc[0][1]._8_8_ = 0;
  __camera2ndc[0][2]._0_8_ = 0;
  __camera2ndc[0][0]._8_8_ = 0;
  __camera2ndc[0][1]._0_8_ = 0;
  lVar4 = in_ST0 / ((longdouble)pCVar1->image_width / (longdouble)pCVar1->image_height);
  uStack_138 = SUB108(lVar4,0);
  __camera2ndc[0][0]._0_2_ = (undefined2)((unkuint10)lVar4 >> 0x40);
  __camera2ndc[1][1]._2_6_ = 0;
  __camera2ndc[0][3]._8_8_ = 0;
  __camera2ndc[1][0]._0_8_ = 0;
  __camera2ndc[1][1]._8_8_ = 0;
  __camera2ndc[1][2]._0_8_ = 0;
  __camera2ndc[1][2]._8_8_ = 0;
  __camera2ndc[1][3]._0_8_ = 0;
  __camera2ndc[1][0]._8_8_ = SUB108(in_ST0,0);
  __camera2ndc[1][1]._0_2_ = (undefined2)((unkuint10)in_ST0 >> 0x40);
  __camera2ndc._120_10_ = (unkbyte10)0;
  lVar4 = -*(longdouble *)&pCVar1->far;
  __camera2ndc[2]._24_10_ = lVar4 / lVar3;
  __camera2ndc[2]._40_10_ = -(longdouble)1;
  __camera2ndc[3][2]._2_6_ = 0;
  __camera2ndc[2][3]._8_8_ = 0;
  __camera2ndc[3][0]._0_8_ = 0;
  __camera2ndc[3][0]._8_8_ = 0;
  __camera2ndc[3][1]._0_8_ = 0;
  __camera2ndc[3][2]._8_8_ = 0;
  __camera2ndc[3][3]._0_8_ = 0;
  lVar3 = (*(longdouble *)&pCVar1->near * lVar4) / lVar3;
  __camera2ndc[3][1]._8_8_ = SUB108(lVar3,0);
  __camera2ndc[3][2]._0_2_ = (undefined2)((unkuint10)lVar3 >> 0x40);
  __camera2ndc[2]._8_10_ = __camera2ndc._120_10_;
  pMVar2 = MatrixFromArray(4,4,(Real_0_ *)&uStack_138);
  a = MatrixTranspose(pMVar2);
  MatrixDestroy(pMVar2);
  pCVar1->camera2ndc = a;
  pMVar2 = MatrixMultiplication(a,pCVar1->world2camera);
  pCVar1->world2ndc = pMVar2;
  pMVar2 = MatrixInverse(pMVar2);
  pCVar1->ndc2world = pMVar2;
  return pCVar1;
}

Assistant:

Camera *CameraPerspectiveProjection(Vector eye, Vector at, Vector up_v, uint16_t image_width, uint16_t image_height, Real near, Real far, Real fov) {
  Camera *c = _CameraNew(eye, at, up_v, image_width, image_height, near, far);
  c->fov = fov;
  Real scale = 1 / tanl(c->fov * 0.5 * M_PI / 180);
  Real aspect = (Real)c->image_width / c->image_height;
  Real range = c->far - c->near;
  Real __camera2ndc[][4] = {{scale / aspect, 0, 0, 0}, {0, scale, 0, 0}, {0, 0, -c->far / range, -1}, {0, 0, -c->far * c->near / range, 0}};
  Matrix *_camera2ndc = MatrixFromArray(4, 4, __camera2ndc);
  Matrix *camera2ndc = MatrixTranspose(_camera2ndc);
  MatrixDestroy(_camera2ndc);
  c->camera2ndc = camera2ndc;
  c->world2ndc = MatrixMultiplication(c->camera2ndc, c->world2camera);
  c->ndc2world = MatrixInverse(c->world2ndc);
  return c;
}